

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdInParse.cpp
# Opt level: O1

int main(int argC,char **argV)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  SAXParser *this;
  ostream *poVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  StdInParseHandlers handler;
  StdInInputSource src;
  StrX local_a8;
  StdInParseHandlers local_a0;
  undefined **local_60 [4];
  wchar16 *local_40;
  
  pcVar7 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (1 < argC) {
    iVar3 = 0;
    uVar6 = 1;
    do {
      pcVar9 = argV[uVar6];
      if (*pcVar9 != '-') break;
      iVar2 = strcmp(pcVar9,"-?");
      if (iVar2 == 0) {
        usage();
        xercesc_4_0::XMLPlatformUtils::Terminate();
        return 2;
      }
      iVar2 = strncmp(pcVar9,"-v=",3);
      if ((iVar2 == 0) || (iVar2 = strncmp(pcVar9,"-V=",3), iVar2 == 0)) {
        pcVar9 = pcVar9 + 3;
        pcVar7 = "never";
        iVar2 = strcmp(pcVar9,"never");
        if (iVar2 == 0) {
          valScheme = Val_Never;
LAB_001036aa:
          bVar8 = true;
        }
        else {
          pcVar7 = "auto";
          iVar2 = strcmp(pcVar9,"auto");
          if (iVar2 == 0) {
            valScheme = Val_Auto;
            goto LAB_001036aa;
          }
          pcVar7 = "always";
          iVar2 = strcmp(pcVar9,"always");
          if (iVar2 == 0) {
            valScheme = Val_Always;
            goto LAB_001036aa;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
          sVar4 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,sVar4);
          cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
          pcVar7 = (char *)(ulong)(uint)(int)cVar1;
          std::ostream::put(-0x50);
          std::ostream::flush();
          xercesc_4_0::XMLPlatformUtils::Terminate();
          iVar3 = 2;
          bVar8 = false;
        }
        if (!bVar8) {
          return iVar3;
        }
      }
      else {
        pcVar7 = "-n";
        iVar2 = strcmp(pcVar9,"-n");
        if (iVar2 != 0) {
          pcVar7 = "-N";
          iVar2 = strcmp(pcVar9,"-N");
          if (iVar2 != 0) {
            pcVar7 = "-s";
            iVar2 = strcmp(pcVar9,"-s");
            if (iVar2 == 0) {
LAB_00103697:
              doSchema = 1;
            }
            else {
              pcVar7 = "-S";
              iVar2 = strcmp(pcVar9,"-S");
              if (iVar2 == 0) goto LAB_00103697;
              pcVar7 = "-f";
              iVar2 = strcmp(pcVar9,"-f");
              if (iVar2 == 0) {
LAB_001036c2:
                schemaFullChecking = 1;
              }
              else {
                pcVar7 = "-F";
                iVar2 = strcmp(pcVar9,"-F");
                if (iVar2 == 0) goto LAB_001036c2;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unknown option \'",0x10);
                pcVar7 = argV[uVar6];
                if (pcVar7 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1091b0);
                }
                else {
                  sVar4 = strlen(pcVar7);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar7,sVar4);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"\', ignoring it\n",0xf);
                cVar1 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
                pcVar7 = (char *)(ulong)(uint)(int)cVar1;
                std::ostream::put(-0x50);
                std::ostream::flush();
              }
            }
            goto LAB_001036b4;
          }
        }
        doNamespaces = 1;
      }
LAB_001036b4:
      uVar6 = uVar6 + 1;
    } while ((uint)argC != uVar6);
  }
  this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pcVar7);
  xercesc_4_0::SAXParser::SAXParser
            (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
  bVar8 = SUB81(this,0);
  xercesc_4_0::SAXParser::setDoNamespaces(bVar8);
  xercesc_4_0::SAXParser::setDoSchema(bVar8);
  xercesc_4_0::SAXParser::setHandleMultipleImports(bVar8);
  xercesc_4_0::SAXParser::setValidationSchemaFullChecking(bVar8);
  StdInParseHandlers::StdInParseHandlers(&local_a0);
  (**(code **)(*(long *)this + 0x20))(this,&local_a0.super_HandlerBase.super_DocumentHandler);
  (**(code **)(*(long *)this + 0x28))(this,&local_a0.super_HandlerBase.super_ErrorHandler);
  xercesc_4_0::InputSource::InputSource
            ((InputSource *)local_60,"stdin",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_60[0] = &PTR__InputSource_00107838;
  xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
  (**(code **)(*(long *)this + 0x30))(this,local_60);
  xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
  iVar3 = xercesc_4_0::SAXParser::getErrorCount();
  if (iVar3 == 0) {
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_a8.fLocalForm = pcVar7;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109078);
    }
    else {
      sVar4 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ms (",5);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," elems, ",8);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," attrs, ",8);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," spaces, ",9);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," chars)",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    StrX::~StrX(&local_a8);
  }
  xercesc_4_0::InputSource::~InputSource((InputSource *)local_60);
  (**(code **)(*(long *)this + 8))(this);
  xercesc_4_0::XMLPlatformUtils::Terminate();
  StdInParseHandlers::~StdInParseHandlers(&local_a0);
  return (uint)(0 < iVar3) << 2;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! Message:\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 2;
        }
         else if (!strncmp(argV[parmInd], "-v=", 3)
              ||  !strncmp(argV[parmInd], "-V=", 3))
        {
            const char* const parm = &argV[parmInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set the options.
    //
    SAXParser* parser = new SAXParser;
    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);


    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handler. We are responsible for cleaning them
    //  up, but since its just stack based here, there's nothing special
    //  to do.
    //
    StdInParseHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);

    unsigned long duration;
    int errorCount = 0;
    // create a faux scope so that 'src' destructor is called before
    // XMLPlatformUtils::Terminate
    {
        //
        //  Kick off the parse and catch any exceptions. Create a standard
        //  input input source and tell the parser to parse from that.
        //
        StdInInputSource src;
        try
        {
            const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
            parser->parse(src);
            const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
            duration = endMillis - startMillis;
            errorCount = parser->getErrorCount();
        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorCount = 2;
            return 4;
        }
        catch (const XMLException& e)
        {
            std::cerr << "\nError during parsing: \n"
                 << StrX(e.getMessage())
                 << "\n" << std::endl;
            errorCount = 1;
            return 4;
        }

        // Print out the stats that we collected and time taken
        if (!errorCount) {
            std::cout << StrX(src.getSystemId()) << ": " << duration << " ms ("
                 << handler.getElementCount() << " elems, "
                 << handler.getAttrCount() << " attrs, "
                 << handler.getSpaceCount() << " spaces, "
                 << handler.getCharacterCount() << " chars)" << std::endl;
        }
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}